

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_disconnect(connectdata *conn,_Bool dead_connection)

{
  Curl_easy *data;
  _func_CURLcode_connectdata_ptr__Bool *p_Var1;
  _Bool _Var2;
  undefined1 pipe_broke;
  
  if (((conn != (connectdata *)0x0) && (data = conn->data, data != (Curl_easy *)0x0)) &&
     (((conn->bits).close != false || ((conn->send_pipe).size + (conn->recv_pipe).size == 0)))) {
    if (conn->dns_entry != (Curl_dns_entry *)0x0) {
      Curl_resolv_unlock(data,conn->dns_entry);
      conn->dns_entry = (Curl_dns_entry *)0x0;
    }
    Curl_hostcache_prune(data);
    Curl_http_ntlm_cleanup(conn);
    p_Var1 = conn->handler->disconnect;
    if (p_Var1 != (_func_CURLcode_connectdata_ptr__Bool *)0x0) {
      (*p_Var1)(conn,dead_connection);
    }
    Curl_infof(data,"Closing connection %ld\n",conn->connection_id);
    Curl_conncache_remove_conn(conn,true);
    Curl_ssl_close(conn,0);
    pipe_broke = 3;
    _Var2 = Curl_pipeline_wanted(data->multi,3);
    if (_Var2) {
      signalPipeClose(&conn->send_pipe,(_Bool)pipe_broke);
      signalPipeClose(&conn->recv_pipe,(_Bool)pipe_broke);
    }
    conn_free(conn);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct Curl_easy *data;
  if(!conn)
    return CURLE_OK; /* this is closed and fine already */
  data = conn->data;

  if(!data) {
    DEBUGF(fprintf(stderr, "DISCONNECT without easy handle, ignoring\n"));
    return CURLE_OK;
  }

  /*
   * If this connection isn't marked to force-close, leave it open if there
   * are other users of it
   */
  if(!conn->bits.close &&
     (conn->send_pipe.size + conn->recv_pipe.size)) {
    DEBUGF(infof(data, "Curl_disconnect, usecounter: %d\n",
                 conn->send_pipe.size + conn->recv_pipe.size));
    return CURLE_OK;
  }

  if(conn->dns_entry != NULL) {
    Curl_resolv_unlock(data, conn->dns_entry);
    conn->dns_entry = NULL;
  }

  Curl_hostcache_prune(data); /* kill old DNS cache entries */

#if !defined(CURL_DISABLE_HTTP) && defined(USE_NTLM)
  /* Cleanup NTLM connection-related data */
  Curl_http_ntlm_cleanup(conn);
#endif

  if(conn->handler->disconnect)
    /* This is set if protocol-specific cleanups should be made */
    conn->handler->disconnect(conn, dead_connection);

    /* unlink ourselves! */
  infof(data, "Closing connection %ld\n", conn->connection_id);
  Curl_conncache_remove_conn(conn, TRUE);

  free_fixed_hostname(&conn->host);
  free_fixed_hostname(&conn->conn_to_host);
  free_fixed_hostname(&conn->http_proxy.host);
  free_fixed_hostname(&conn->socks_proxy.host);

  Curl_ssl_close(conn, FIRSTSOCKET);

  /* Indicate to all handles on the pipe that we're dead */
  if(Curl_pipeline_wanted(data->multi, CURLPIPE_ANY)) {
    signalPipeClose(&conn->send_pipe, TRUE);
    signalPipeClose(&conn->recv_pipe, TRUE);
  }

  conn_free(conn);

  return CURLE_OK;
}